

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall Lib::Array<unsigned_int>::Array(Array<unsigned_int> *this,Array<unsigned_int> *o)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  size_t sVar4;
  ulong uVar5;
  
  this->_vptr_Array = (_func_int **)&PTR_fillInterval_00b27cf0;
  sVar1 = o->_capacity;
  this->_capacity = sVar1;
  if (o->_array == (uint *)0x0) {
    this->_array = (uint *)0x0;
  }
  else {
    uVar5 = sVar1 * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      puVar3 = (uint *)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar5 < 0x11) {
      puVar3 = (uint *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar5 < 0x19) {
      puVar3 = (uint *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar5 < 0x21) {
      puVar3 = (uint *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar5 < 0x31) {
      puVar3 = (uint *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar5 < 0x41) {
      puVar3 = (uint *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      puVar3 = (uint *)::operator_new(uVar5,0x10);
    }
    this->_array = puVar3;
    sVar1 = this->_capacity;
    if (sVar1 != 0) {
      puVar2 = o->_array;
      sVar4 = 0;
      do {
        puVar3[sVar4] = puVar2[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
  }
  return;
}

Assistant:

Array (const Array &o) : _capacity(o._capacity) {
    if (o._array) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),"Array<>");
      _array = static_cast<C*>(mem);
      for(size_t i=0; i<_capacity; i++) {
        ::new (&_array[i]) C(o._array[i]);
      }
    } else {
      _array = 0;
    }
  }